

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-grib-cursor.c
# Opt level: O1

int coda_grib_cursor_read_float(coda_cursor_conflict *cursor,float *dst)

{
  byte bVar1;
  undefined1 uVar2;
  coda_dynamic_type_struct *pcVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  byte bVar13;
  sbyte sVar14;
  ulong uVar15;
  long lVar16;
  ushort *puVar17;
  long lVar18;
  byte *pbVar19;
  byte *pbVar20;
  ulong uVar21;
  uchar *v;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  long byte_offset;
  double dVar25;
  int64_t ivalue;
  uint8_t buffer [4];
  byte bStack_6d;
  undefined4 local_6c;
  undefined8 local_68;
  byte abStack_60 [4];
  ushort local_5c;
  ushort local_5a;
  coda_product *local_58;
  ulong local_50;
  long local_48;
  long local_40;
  float *local_38;
  
  iVar12 = cursor->n;
  if (iVar12 < 2) {
    __assert_fail("cursor->n > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                  ,0x90,"int coda_grib_cursor_read_float(const coda_cursor *, float *)");
  }
  pcVar3 = cursor->stack[iVar12 - 2].type;
  if (pcVar3->definition->type_class != coda_array_class) {
    __assert_fail("array->definition->type_class == coda_array_class",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                  ,0x92,"int coda_grib_cursor_read_float(const coda_cursor *, float *)");
  }
  uVar23 = cursor->stack[iVar12 - 1].index;
  if (*(int *)&pcVar3[2].definition == 0) {
    iVar12 = read_bytes((coda_product *)cursor->product[1].filename,
                        (*(long *)(pcVar3 + 2) >> 3) + uVar23 * 4,4,dst);
    if (iVar12 == 0) {
      uVar2 = *(undefined1 *)((long)dst + 3);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)dst;
      *(undefined1 *)dst = uVar2;
      puVar17 = (ushort *)((long)dst + 1);
      *puVar17 = *puVar17 << 8 | *puVar17 >> 8;
      return 0;
    }
    return -1;
  }
  local_68 = 0;
  if (*(int *)((long)&pcVar3[2].definition + 4) == 0) {
    *dst = *(float *)&pcVar3[3].field_0x4;
LAB_00118535:
    bVar10 = false;
    iVar12 = 0;
    goto LAB_001187bd;
  }
  if (pcVar3[4].definition != (coda_type *)0x0) {
    uVar11 = (uint)uVar23 & 7;
    bVar13 = (byte)uVar11 ^ 7;
    bVar1 = *(byte *)((long)&(pcVar3[4].definition)->format + ((long)uVar23 >> 3));
    if ((bVar1 >> bVar13 & 1) == 0) {
      dVar25 = coda_NaN();
      *dst = (float)dVar25;
    }
    else {
      lVar18 = (long)uVar23 >> 7;
      if (lVar18 < 1) {
        uVar15 = 0;
      }
      else {
        pbVar19 = (byte *)(*(long *)(pcVar3 + 5) + 0xf);
        uVar15 = 0;
        do {
          uVar15 = uVar15 + *pbVar19;
          pbVar19 = pbVar19 + 0x10;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      if ((uVar23 & 0x78) != 0) {
        uVar15 = uVar15 + *(byte *)(*(long *)(pcVar3 + 5) + -1 + ((long)uVar23 >> 3));
      }
      uVar23 = uVar15;
      if ((ulong)uVar11 != 0) {
        lVar18 = 0;
        do {
          uVar23 = uVar23 + ((bVar1 >> ((int)lVar18 + 7U & 0x1f) & 1) != 0);
          lVar18 = lVar18 + -1;
        } while (-lVar18 != (ulong)uVar11);
      }
    }
    if ((1 << bVar13 & (uint)bVar1) == 0) goto LAB_00118535;
  }
  uVar11 = *(uint *)((long)&pcVar3[2].definition + 4);
  uVar15 = (ulong)(int)uVar11;
  lVar16 = (long)(int)(-((int)uVar11 >> 3) - (uint)((uVar11 & 7) != 0));
  pbVar19 = abStack_60 + lVar16;
  lVar24 = uVar23 * uVar15 + *(long *)(pcVar3 + 2);
  local_58 = (coda_product *)cursor->product[1].filename;
  uVar23 = (ulong)((uint)lVar24 & 7);
  lVar18 = uVar23 + uVar15;
  uVar22 = -(int)lVar18 & 7;
  sVar14 = (sbyte)uVar22;
  byte_offset = lVar24 >> 3;
  local_38 = dst;
  if (lVar18 < 9) {
    iVar12 = read_bytes(local_58,byte_offset,1,pbVar19);
    if (iVar12 != 0) {
LAB_00118757:
      iVar12 = -1;
      bVar10 = false;
      goto LAB_001187bd;
    }
    if (uVar22 != 0) {
      *pbVar19 = *pbVar19 >> sVar14;
    }
    if ((uVar15 & 7) != 0) {
      *pbVar19 = *pbVar19 & ~(byte)(-1 << ((byte)uVar11 & 0x1f));
    }
  }
  else if (uVar22 == 0) {
    uVar23 = uVar15 & 7;
    if (uVar23 != 0) {
      iVar12 = read_bytes(local_58,byte_offset,1,&local_5c);
      if (iVar12 != 0) {
        bVar10 = false;
        iVar12 = -1;
        goto LAB_001187bd;
      }
      abStack_60[lVar16] = ~(-1 << (sbyte)uVar23) & (byte)local_5c;
      pbVar19 = abStack_60 + lVar16 + 1;
      lVar24 = lVar24 + uVar23;
      uVar15 = uVar15 & 0xfffffffffffffff8;
    }
    if ((0 < (long)uVar15) &&
       (iVar12 = read_bytes(local_58,lVar24 >> 3,uVar15 >> 3,pbVar19), iVar12 != 0))
    goto LAB_00118757;
  }
  else {
    uVar21 = uVar15 + (((ulong)((long)uVar15 / 6 + ((long)uVar15 >> 0x3f)) >> 2) -
                      ((long)uVar15 >> 0x3f)) * -0x18;
    if (uVar21 != 0) {
      uVar23 = uVar23 + uVar21;
      local_40 = ((uVar23 >> 3) + 1) - (ulong)((uVar23 & 7) == 0);
      local_48 = ((uVar21 >> 3) + 1) - (ulong)((uVar21 & 7) == 0);
      puVar17 = &local_5c;
      local_50 = uVar21;
      iVar12 = read_bytes(local_58,byte_offset,local_40,puVar17);
      lVar18 = local_48;
      uVar23 = local_50;
      if (iVar12 == 0) {
        local_6c = 0;
        if (local_40 != 0) {
          lVar16 = 0;
          do {
            *(char *)((long)&local_6c + lVar16 + 3) = (char)*puVar17;
            lVar16 = lVar16 + -1;
            puVar17 = (ushort *)((long)puVar17 + 1);
          } while (-lVar16 != local_40);
        }
        local_6c = ~(-1 << ((byte)local_50 & 0x1f)) & 0U >> (sVar14 + (char)local_40 * -8 & 0x1fU);
        pbVar20 = pbVar19;
        for (lVar16 = local_48; lVar16 != 0; lVar16 = lVar16 + -1) {
          *pbVar20 = (&bStack_6d)[lVar16];
          pbVar20 = pbVar20 + 1;
        }
        pbVar19 = pbVar19 + lVar18;
        lVar24 = lVar24 + uVar23;
        uVar15 = uVar15 - uVar23;
      }
      if (iVar12 != 0) goto LAB_00118757;
    }
    if (0 < (long)uVar15) {
      lVar18 = uVar15 + 0x18;
      do {
        iVar12 = read_bytes(local_58,lVar24 >> 3,4,&local_5c);
        if (iVar12 != 0) goto LAB_00118757;
        local_6c = CONCAT22(local_5c << 8 | local_5c >> 8,local_5a << 8 | local_5a >> 8);
        uVar11 = local_6c >> sVar14;
        local_6c._2_1_ = (byte)(uVar11 >> 0x10);
        *pbVar19 = local_6c._2_1_;
        local_6c._1_1_ = (byte)(uVar11 >> 8);
        pbVar19[1] = local_6c._1_1_;
        local_6c._0_1_ = (byte)uVar11;
        pbVar19[2] = (byte)local_6c;
        pbVar19 = pbVar19 + 3;
        lVar24 = lVar24 + 0x18;
        lVar18 = lVar18 + -0x18;
        local_6c = uVar11;
      } while (0x18 < lVar18);
    }
  }
  uVar4 = (ushort)local_68 << 8;
  uVar7 = (ushort)local_68 >> 8;
  uVar5 = local_68._2_2_ << 8;
  uVar8 = local_68._2_2_ >> 8;
  uVar6 = local_68._4_2_ << 8;
  uVar9 = local_68._4_2_ >> 8;
  local_68 = CONCAT26(uVar4 | uVar7,
                      CONCAT24(uVar5 | uVar8,
                               CONCAT22(uVar6 | uVar9,local_68._6_2_ << 8 | local_68._6_2_ >> 8)));
  *local_38 = (float)((double)local_68 * (double)pcVar3[3].definition + *(double *)(pcVar3 + 4));
  iVar12 = 0;
  bVar10 = true;
LAB_001187bd:
  if (bVar10) {
    return 0;
  }
  return iVar12;
}

Assistant:

int coda_grib_cursor_read_float(const coda_cursor *cursor, float *dst)
{
    coda_grib_value_array *array;
    long index;

    assert(cursor->n > 1);
    array = (coda_grib_value_array *)cursor->stack[cursor->n - 2].type;
    assert(array->definition->type_class == coda_array_class);
    index = cursor->stack[cursor->n - 1].index;
    if (array->simple_packing)
    {
        int64_t ivalue = 0;
        uint8_t *buffer;

        if (array->element_bit_size == 0)
        {
            *((float *)dst) = array->referenceValue;
            return 0;
        }
        if (array->bitmask != NULL)
        {
            uint8_t bm;
            long bm_index;
            long value_index = 0;
            long i;

            bm_index = index >> 3;
            bm = array->bitmask[bm_index];
            if (!((bm >> (7 - (index & 0x7))) & 1))
            {
                /* bitmask value is 0 -> return NaN */
                *((float *)dst) = (float)coda_NaN();
                return 0;
            }

            /* bitmask value is 1 -> update index to be the index in the value array */
            for (i = 0; i < bm_index >> 4; i++)
            {
                /* advance value_index based on cumsum of blocks of 128 bitmap bits (= 16 bytes) */
                value_index += array->bitmask_cumsum128[16 * i + 15];
            }
            if (bm_index % 16 != 0)
            {
                value_index += array->bitmask_cumsum128[bm_index - 1];
            }
            bm = array->bitmask[bm_index];
            for (i = 0; i < (index & 0x7); i++)
            {
                value_index += (bm >> (7 - i)) & 1;
            }
            index = value_index;
        }
        buffer = &((uint8_t *)&ivalue)[8 - bit_size_to_byte_size(array->element_bit_size)];
        if (read_bits(((coda_grib_product *)cursor->product)->raw_product,
                      array->bit_offset + index * array->element_bit_size, array->element_bit_size, buffer) != 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap8(&ivalue);
#endif
        *((float *)dst) = (float)(ivalue * array->scalefactor + array->offset);
    }
    else
    {
        if (read_bytes(((coda_grib_product *)cursor->product)->raw_product, (array->bit_offset >> 3) + index * 4, 4,
                       dst) != 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_float(dst);
#endif
    }

    return 0;
}